

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::TransactionContext::VerifyInputSignature
          (TransactionContext *this,ByteData *signature,Pubkey *pubkey,OutPoint *outpoint,
          Script *script,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  byte bVar1;
  undefined8 in_RCX;
  Pubkey *in_RDX;
  ByteData *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  undefined8 in_R8;
  SigHashType *in_R9;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  ByteData sighash;
  vector local_88 [24];
  ByteData256 local_70;
  SigHashType local_54 [12];
  undefined1 local_48 [48];
  Pubkey *local_18;
  ByteData *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  cfd::core::SigHashType::SigHashType(local_54,in_R9);
  (**(code **)((in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + 0xa0))
            (local_48,in_RDI,in_RCX,in_R8,local_54,in_stack_00000008,in_stack_00000010);
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData256::ByteData256(&local_70,local_88);
  bVar1 = cfd::core::SignatureUtil::VerifyEcSignature(&local_70,local_18,local_10);
  core::ByteData256::~ByteData256((ByteData256 *)0x3b24bc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RDI);
  core::ByteData::~ByteData((ByteData *)0x3b24d3);
  return (bool)(bVar1 & 1);
}

Assistant:

bool TransactionContext::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const OutPoint& outpoint,
    const Script& script, SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  auto sighash =
      CreateSignatureHash(outpoint, script, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}